

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

int Gia_ManSuppSizeTest(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int level;
  long lVar5;
  long lVar6;
  Gia_Obj_t *pObj;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar2 = p->nObjs;
  if (iVar2 < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    lVar6 = 0;
    uVar4 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar5);
      uVar1 = *(uint *)pObj;
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        Gia_ManIncrementTravId(p);
        iVar2 = Gia_ManSuppSize_rec(p,pObj);
        uVar4 = uVar4 + (iVar2 < 0x11);
        iVar2 = p->nObjs;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar6 < iVar2);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar4,
         (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + iVar2));
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar3) / 1000000.0);
  return uVar4;
}

Assistant:

int Gia_ManSuppSizeTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            Counter += (Gia_ManSuppSizeOne(p, pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Gia_ManAndNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}